

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O2

Node * __thiscall SplayTree::insert(SplayTree *this,int value,Node *root)

{
  Node *pNVar1;
  long lVar2;
  long lStack_20;
  
  pNVar1 = insert::p_node;
  if (insert::p_node == (Node *)0x0) {
    pNVar1 = newNode(this,value);
    insert::p_node = pNVar1;
  }
  else {
    insert::p_node->value = value;
  }
  if (root != (Node *)0x0) {
    pNVar1 = splay(this,value,root);
    if (value < pNVar1->value) {
      lVar2 = 0x10;
      lStack_20 = 8;
    }
    else {
      if (value <= pNVar1->value) {
        return pNVar1;
      }
      lVar2 = 8;
      lStack_20 = 0x10;
    }
    *(undefined8 *)((long)&insert::p_node->value + lStack_20) =
         *(undefined8 *)((long)&pNVar1->value + lStack_20);
    *(Node **)((long)&insert::p_node->value + lVar2) = pNVar1;
    *(undefined8 *)((long)&pNVar1->value + lStack_20) = 0;
    pNVar1 = insert::p_node;
  }
  insert::p_node = (Node *)0x0;
  return pNVar1;
}

Assistant:

SplayTree::Node *SplayTree::insert(int value, Node *root) {
    static Node *p_node = nullptr;
    if (!p_node) {
        p_node = newNode(value);
    } else {// could take advantage of the node remains because of there was duplicate key before.
        p_node->value = value;
    }
    if (!root) {
        root = p_node;
        p_node = nullptr;
        return root;
    }
    root = splay(value, root);
    /* This is BST that, all keys <= root->key is in root->lChild, all keys >
       root->key is in root->rChild. (This BST doesn't allow duplicate keys.) */
    if (value < root->value) {
        p_node->leftChild = root->leftChild;
        p_node->rightChild = root;
        root->leftChild = nullptr;
        root = p_node;
    } else if (value > root->value) {
        p_node->rightChild = root->rightChild;
        p_node->leftChild = root;
        root->rightChild = nullptr;
        root = p_node;
    } else {
        return root;
    }
    p_node = nullptr;
    return root;
}